

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_isseekable(jas_stream_t *stream)

{
  long lVar1;
  jas_stream_t *stream_local;
  
  if (stream->ops_ == &jas_stream_memops) {
    stream_local._4_4_ = 1;
  }
  else if (stream->ops_ == &jas_stream_fileops) {
    lVar1 = (*stream->ops_->seek_)(stream->obj_,0,1);
    if (lVar1 < 0) {
      stream_local._4_4_ = 0;
    }
    else {
      stream_local._4_4_ = 1;
    }
  }
  else {
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int jas_stream_isseekable(jas_stream_t *stream)
{
	if (stream->ops_ == &jas_stream_memops) {
		return 1;
	} else if (stream->ops_ == &jas_stream_fileops) {
		if ((*stream->ops_->seek_)(stream->obj_, 0, SEEK_CUR) < 0) {
			return 0;
		}
		return 1;
	} else {
		return 0;
	}
}